

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

Quat<double> *
Imath_3_2::extractQuat<double>(Quat<double> *__return_storage_ptr__,Matrix44<double> *mat)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double q [4];
  double local_58 [5];
  
  __return_storage_ptr__->r = 1.0;
  (__return_storage_ptr__->v).x = 0.0;
  (__return_storage_ptr__->v).y = 0.0;
  (__return_storage_ptr__->v).z = 0.0;
  dVar10 = mat->x[0][0];
  dVar2 = mat->x[1][1];
  dVar9 = mat->x[2][2];
  dVar3 = dVar10 + dVar2 + dVar9;
  if (dVar3 <= 0.0) {
    bVar4 = dVar10 < dVar2;
    pdVar1 = mat->x[bVar4] + bVar4;
    uVar7 = 2;
    if (dVar9 < *pdVar1 || dVar9 == *pdVar1) {
      uVar7 = (ulong)bVar4;
    }
    lVar6 = (long)*(int *)(&DAT_001711b4 + uVar7 * 4);
    lVar5 = (long)*(int *)(&DAT_001711b4 + lVar6 * 4);
    uVar8 = (int)uVar7 << 5;
    dVar10 = (*(double *)((long)mat->x[0] + uVar7 * 8 + (ulong)uVar8) -
             (*(double *)((long)mat->x + lVar6 * 0x28) + *(double *)((long)mat->x + lVar5 * 0x28)))
             + 1.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    uVar7 = (ulong)(uint)((int)uVar7 * 8);
    *(double *)((long)local_58 + uVar7) = dVar10 * 0.5;
    dVar10 = (double)(~-(ulong)(dVar10 != 0.0) & (ulong)dVar10 |
                     (ulong)(0.5 / dVar10) & -(ulong)(dVar10 != 0.0));
    local_58[3] = (mat->x[lVar6][lVar5] - mat->x[lVar5][lVar6]) * dVar10;
    local_58[lVar6] =
         (*(double *)((long)mat->x[0] + lVar6 * 8 + (ulong)uVar8) +
         *(double *)((long)mat->x[lVar6] + uVar7)) * dVar10;
    local_58[lVar5] =
         (*(double *)((long)mat->x[0] + lVar5 * 8 + (ulong)uVar8) +
         *(double *)((long)mat->x[lVar5] + uVar7)) * dVar10;
    (__return_storage_ptr__->v).x = local_58[0];
    (__return_storage_ptr__->v).y = local_58[1];
    (__return_storage_ptr__->v).z = local_58[2];
    __return_storage_ptr__->r = local_58[3];
  }
  else {
    dVar3 = dVar3 + 1.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar10 = mat->x[1][2];
    dVar2 = mat->x[2][1];
    dVar9 = 0.5 / dVar3;
    __return_storage_ptr__->r = dVar3 * 0.5;
    (__return_storage_ptr__->v).x = (dVar10 - dVar2) * dVar9;
    dVar10 = mat->x[0][1];
    dVar2 = mat->x[1][0];
    (__return_storage_ptr__->v).y = dVar9 * (mat->x[2][0] - mat->x[0][2]);
    (__return_storage_ptr__->v).z = dVar9 * (dVar10 - dVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Quat<T>
extractQuat (const Matrix44<T>& mat)
{
    T       tr, s;
    T       q[4];
    int     i, j, k;
    Quat<T> quat;

    int nxt[3] = {1, 2, 0};
    tr         = mat[0][0] + mat[1][1] + mat[2][2];

    // check the diagonal
    if (tr > 0.0)
    {
        s      = std::sqrt (tr + T (1.0));
        quat.r = s / T (2.0);
        s      = T (0.5) / s;

        quat.v.x = (mat[1][2] - mat[2][1]) * s;
        quat.v.y = (mat[2][0] - mat[0][2]) * s;
        quat.v.z = (mat[0][1] - mat[1][0]) * s;
    }
    else
    {
        // diagonal is negative
        i = 0;
        if (mat[1][1] > mat[0][0]) i = 1;
        if (mat[2][2] > mat[i][i]) i = 2;

        j = nxt[i];
        k = nxt[j];
        s = std::sqrt ((mat[i][i] - (mat[j][j] + mat[k][k])) + T (1.0));

        q[i] = s * T (0.5);
        if (s != T (0.0)) s = T (0.5) / s;

        q[3] = (mat[j][k] - mat[k][j]) * s;
        q[j] = (mat[i][j] + mat[j][i]) * s;
        q[k] = (mat[i][k] + mat[k][i]) * s;

        quat.v.x = q[0];
        quat.v.y = q[1];
        quat.v.z = q[2];
        quat.r   = q[3];
    }

    return quat;
}